

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

bool __thiscall
TcpSocketImpl::Connect(TcpSocketImpl *this,char *szIpToWhere,uint16_t sPort,int AddrHint)

{
  int32_t *piVar1;
  BaseSocket *pBVar2;
  int iVar3;
  TcpSocket *__args;
  int *piVar4;
  int *piVar5;
  bool bVar6;
  thread tStack_a8;
  addrinfo *lstAddr;
  int32_t *local_98;
  TcpSocketImpl *local_90;
  uint32_t on;
  size_type local_80;
  addrinfo hint;
  
  piVar1 = &(this->super_BaseSocketImpl).m_fSock;
  iVar3 = (this->super_BaseSocketImpl).m_fSock;
  if (iVar3 != -1) {
    close(iVar3);
    *piVar1 = -1;
  }
  lstAddr = (addrinfo *)0x0;
  hint.ai_canonname = (char *)0x0;
  hint.ai_next = (addrinfo *)0x0;
  hint.ai_addrlen = 0;
  hint._20_4_ = 0;
  hint.ai_addr = (sockaddr *)0x0;
  hint._0_8_ = (ulong)(uint)AddrHint << 0x20;
  hint.ai_socktype = 1;
  hint.ai_protocol = 0;
  local_98 = piVar1;
  std::__cxx11::to_string((string *)&on,(uint)sPort);
  iVar3 = getaddrinfo(szIpToWhere,(char *)_on,(addrinfo *)&hint,(addrinfo **)&lstAddr);
  std::__cxx11::string::~string((string *)&on);
  piVar1 = local_98;
  if (iVar3 == 0) {
    iVar3 = socket(lstAddr->ai_family,lstAddr->ai_socktype,lstAddr->ai_protocol);
    *piVar1 = iVar3;
    if (iVar3 == -1) {
      piVar4 = (int *)__cxa_allocate_exception(4);
      piVar5 = __errno_location();
      *piVar4 = *piVar5;
      __cxa_throw(piVar4,&int::typeinfo,0);
    }
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])(this,piVar1);
    if (lstAddr->ai_family == 10) {
      _on = (code *)((ulong)_on & 0xffffffff00000000);
      iVar3 = setsockopt(*piVar1,0x29,0x1a,&on,4);
      if (iVar3 == -1) {
        piVar4 = (int *)__cxa_allocate_exception(4);
        piVar5 = __errno_location();
        *piVar4 = *piVar5;
        __cxa_throw(piVar4,&int::typeinfo,0);
      }
    }
    iVar3 = connect(*piVar1,(sockaddr *)lstAddr->ai_addr,lstAddr->ai_addrlen);
    local_90 = this;
    if (iVar3 == -1) {
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      (this->super_BaseSocketImpl).m_iError = iVar3;
      if (iVar3 != 0x73) {
        piVar4 = (int *)__cxa_allocate_exception(4);
        *piVar4 = (this->super_BaseSocketImpl).m_iError;
        __cxa_throw(piVar4,&int::typeinfo,0);
      }
      (this->super_BaseSocketImpl).m_iError = 0;
      _on = ConnectThread;
      local_80 = 0;
      std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
                (&tStack_a8,(type *)&on,&local_90);
      std::thread::operator=(&this->m_thConnect,&tStack_a8);
      std::thread::~thread(&tStack_a8);
    }
    else {
      GetConnectionInfo(this);
      _on = SelectThread;
      local_80 = 0;
      std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
                (&tStack_a8,(type *)&on,&local_90);
      std::thread::operator=(&(this->super_BaseSocketImpl).m_thListen,&tStack_a8);
      std::thread::~thread(&tStack_a8);
      _on = WriteThread;
      local_80 = 0;
      local_90 = this;
      std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
                (&tStack_a8,(type *)&on,&local_90);
      std::thread::operator=(&(this->super_BaseSocketImpl).m_thWrite,&tStack_a8);
      std::thread::~thread(&tStack_a8);
      pBVar2 = (this->super_BaseSocketImpl).m_pBkRef;
      if (pBVar2 == (BaseSocket *)0x0) {
        __args = (TcpSocket *)0x0;
      }
      else {
        __args = (TcpSocket *)__dynamic_cast(pBVar2,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
      }
      if (__args == (TcpSocket *)0x0 ||
          (this->m_fClientConnectedParam).super__Function_base._M_manager == (_Manager_type)0x0) {
        if ((this->m_fClientConnected).super__Function_base._M_manager != (_Manager_type)0x0 &&
            __args != (TcpSocket *)0x0) {
          std::function<void_(TcpSocket_*)>::operator()(&this->m_fClientConnected,__args);
        }
      }
      else {
        std::function<void_(TcpSocket_*,_void_*)>::operator()
                  (&this->m_fClientConnectedParam,__args,(this->super_BaseSocketImpl).m_pvUserData);
      }
      if ((this->m_fClientConnectedSsl).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(TcpSocketImpl_*)>::operator()
                  (&this->m_fClientConnectedSsl,(TcpSocketImpl *)0x0);
      }
    }
    bVar6 = true;
    freeaddrinfo((addrinfo *)lstAddr);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool TcpSocketImpl::Connect(const char* const szIpToWhere, const uint16_t sPort, const int AddrHint/* = AF_UNSPEC*/)
{
    if (m_fSock != INVALID_SOCKET)
    {
        ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;
    }

    struct addrinfo* lstAddr{}, hint{};
    hint.ai_family = AddrHint;
    hint.ai_socktype = SOCK_STREAM;

    if (::getaddrinfo(szIpToWhere, to_string(sPort).c_str(), &hint, &lstAddr) != 0)
        return false;

    bool bRet = true;

    try
    {
        m_fSock = ::socket(lstAddr->ai_family, lstAddr->ai_socktype, lstAddr->ai_protocol);
        if (m_fSock == INVALID_SOCKET)
            throw WSAGetLastError();

        SetSocketOption(m_fSock);

        if (lstAddr->ai_family == AF_INET6)
        {
            constexpr uint32_t on = 0;
            if (::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_V6ONLY, reinterpret_cast<const char*>(&on), sizeof(on)) == -1)
                throw WSAGetLastError();
        }

        const int rc = ::connect(m_fSock, lstAddr->ai_addr, static_cast<int>(lstAddr->ai_addrlen));
        if (rc == SOCKET_ERROR)
        {
            m_iError = WSAGetLastError();
#if defined (_WIN32) || defined (_WIN64)
            if (m_iError != WSAEWOULDBLOCK)
#else
            if (m_iError != EINPROGRESS)
#endif
                throw m_iError;

            m_iError = 0;
            m_thConnect = thread(&TcpSocketImpl::ConnectThread, this);
        }
        else
        {
            GetConnectionInfo();

            m_thListen = thread(&TcpSocketImpl::SelectThread, this);
            m_thWrite = thread(&TcpSocketImpl::WriteThread, this);

            TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
            if (m_fClientConnectedParam && pTcpSocket != nullptr)
                m_fClientConnectedParam(pTcpSocket, m_pvUserData);
            else if (m_fClientConnected && pTcpSocket != nullptr)
                m_fClientConnected(pTcpSocket);

            if (m_fClientConnectedSsl)
                m_fClientConnectedSsl(nullptr);
        }
    }

    catch (const int iSocketErr)
    {
        m_iError = iSocketErr;
        m_iErrLoc = 1;

        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }
        bRet = false;
    }

    ::freeaddrinfo(lstAddr);

    return bRet;
}